

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  size_t sVar3;
  ZSTD_CCtx_params ZStack_b8;
  
  uVar1 = 0;
  if (params.fParams.contentSizeFlag != 0) {
    uVar1 = pss + 1;
  }
  zcs->streamStage = zcss_init;
  if (pss != 0) {
    uVar1 = pss + 1;
  }
  zcs->pledgedSrcSizePlusOne = uVar1;
  uVar2 = 0xffffffffffffffd6;
  if ((((0xffffffe9 < params.cParams.windowLog - 0x20) &&
       (0xffffffe6 < params.cParams.chainLog - 0x1f)) &&
      (0xffffffe6 < params.cParams.hashLog - 0x1f)) &&
     (((0xffffffe1 < params.cParams.searchLog - 0x1f && (0xfffffffa < params.cParams.minMatch - 8))
      && (params.cParams.targetLength < 0x20001)))) {
    uVar2 = 0xffffffffffffffd6;
    if (0xfffffff6 < params.cParams.strategy + ~ZSTD_btultra2) {
      uVar2 = 0;
    }
  }
  if (uVar2 < 0xffffffffffffff89) {
    ZSTD_assignParamsToCCtxParams(&ZStack_b8,&zcs->requestedParams,&params);
    memcpy(&zcs->requestedParams,&ZStack_b8,0x90);
    sVar3 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
    uVar2 = 0;
    if (0xffffffffffffff88 < sVar3) {
      uVar2 = sVar3;
    }
  }
  return uVar2;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) );
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) );
    zcs->requestedParams = ZSTD_assignParamsToCCtxParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) );
    return 0;
}